

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg_1.0.0.hpp
# Opt level: O0

optional<svg::Point> *
svg::getMaxPoint(optional<svg::Point> *__return_storage_ptr__,
                vector<svg::Point,_std::allocator<svg::Point>_> *points)

{
  bool bVar1;
  const_reference pvVar2;
  size_type sVar3;
  uint local_24;
  undefined1 auStack_20 [4];
  uint i;
  Point max;
  vector<svg::Point,_std::allocator<svg::Point>_> *points_local;
  
  max.y = (double)points;
  bVar1 = std::vector<svg::Point,_std::allocator<svg::Point>_>::empty(points);
  if (bVar1) {
    optional<svg::Point>::optional(__return_storage_ptr__);
  }
  else {
    pvVar2 = std::vector<svg::Point,_std::allocator<svg::Point>_>::operator[]
                       ((vector<svg::Point,_std::allocator<svg::Point>_> *)max.y,0);
    _auStack_20 = pvVar2->x;
    max.x = pvVar2->y;
    local_24 = 0;
    while( true ) {
      sVar3 = std::vector<svg::Point,_std::allocator<svg::Point>_>::size
                        ((vector<svg::Point,_std::allocator<svg::Point>_> *)max.y);
      if (sVar3 <= local_24) break;
      pvVar2 = std::vector<svg::Point,_std::allocator<svg::Point>_>::operator[]
                         ((vector<svg::Point,_std::allocator<svg::Point>_> *)max.y,(ulong)local_24);
      if (_auStack_20 < pvVar2->x) {
        pvVar2 = std::vector<svg::Point,_std::allocator<svg::Point>_>::operator[]
                           ((vector<svg::Point,_std::allocator<svg::Point>_> *)max.y,(ulong)local_24
                           );
        _auStack_20 = pvVar2->x;
      }
      pvVar2 = std::vector<svg::Point,_std::allocator<svg::Point>_>::operator[]
                         ((vector<svg::Point,_std::allocator<svg::Point>_> *)max.y,(ulong)local_24);
      if (max.x < pvVar2->y) {
        pvVar2 = std::vector<svg::Point,_std::allocator<svg::Point>_>::operator[]
                           ((vector<svg::Point,_std::allocator<svg::Point>_> *)max.y,(ulong)local_24
                           );
        max.x = pvVar2->y;
      }
      local_24 = local_24 + 1;
    }
    optional<svg::Point>::optional(__return_storage_ptr__,(Point *)auStack_20);
  }
  return __return_storage_ptr__;
}

Assistant:

optional<Point> getMaxPoint(std::vector<Point> const & points)
    {
        if (points.empty())
            return optional<Point>();

        Point max = points[0];
        for (unsigned i = 0; i < points.size(); ++i) {
            if (points[i].x > max.x)
                max.x = points[i].x;
            if (points[i].y > max.y)
                max.y = points[i].y;
        }
        return optional<Point>(max);
    }